

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

void __thiscall
CompressedArray::const_iterator::switch_to_block(const_iterator *this,uint32_t block_index)

{
  CompressedArray *pCVar1;
  pointer pBVar2;
  uint32_t uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)block_index;
  pCVar1 = this->array;
  pBVar2 = (pCVar1->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(pCVar1->headers).
                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4;
  if (uVar5 < uVar6) {
    this->block_index = block_index;
    uVar3 = pBVar2[uVar5].offset;
    this->record_index = pBVar2[uVar5].record_index;
    this->offset = uVar3;
    (this->record).key = pBVar2[uVar5].key;
    read_value(this);
    bVar4 = read_bit(this);
    this->same_word = bVar4;
  }
  else {
    this->block_index = (uint32_t)uVar6;
    this->record_index = pCVar1->record_count;
    this->offset = (*(int *)&(pCVar1->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   *(int *)&(pCVar1->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                   *(uint *)((long)&(pCVar1->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_finish.
                                    super__Bit_iterator_base + 8);
  }
  return;
}

Assistant:

void CompressedArray::const_iterator::switch_to_block(uint32_t block_index) {
    if (block_index >= array->headers.size()) {
        this->block_index = uint32_t(array->headers.size());
        record_index = array->record_count;
        offset = uint32_t(array->data.size());
    } else {
        this->block_index = block_index;
        record_index = array->headers[block_index].record_index;
        offset = array->headers[block_index].offset;

        record.key = array->headers[block_index].key;
        read_value();

        same_word = read_bit();
    }
}